

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O0

int parse_pmc_id(uint32_t pmc_id,chipset_info *info)

{
  _Bool _Var1;
  uint uVar2;
  gpu_index local_1c;
  int i;
  chipset_info *info_local;
  uint32_t pmc_id_local;
  
  memset(info,0,0x20);
  info->endian = 0;
  info->gpu = GPU_UNKNOWN;
  info->gpu_desc = (gpu *)0x0;
  _Var1 = pmc_id_flipped(pmc_id);
  info_local._0_4_ = pmc_id;
  if (_Var1) {
    info->endian = 1;
    uVar2 = pmc_id << 0x10 | pmc_id >> 0x10;
    info_local._0_4_ = (uVar2 & 0xff00ff) << 8 | (uVar2 & 0xff00ff00) >> 8;
  }
  info->pmc_id = (uint32_t)info_local;
  if ((((uint32_t)info_local & 0x80000000) == 0) || (((uint32_t)info_local & 0xf00) == 0)) {
    if (((uint32_t)info_local & 0x80) == 0) {
      if (((uint32_t)info_local & 0xf000) == 0) {
        info->chipset = (uint32_t)info_local >> 0x10 & 0xf;
        info->card_type = info->chipset;
        if (info->chipset == 1) {
          info->gpu = GPU_NV1;
        }
        else if (info->chipset == 3) {
          if (((uint32_t)info_local & 0xff) < 0x20) {
            info->gpu = GPU_NV3;
          }
          else {
            info->gpu = GPU_NV3T;
          }
        }
      }
      else {
        if (((uint32_t)info_local & 0xf00000) == 0) {
          info->chipset = 4;
          info->gpu = GPU_NV4;
        }
        else {
          info->chipset = 5;
          info->gpu = GPU_NV5;
        }
        info->card_type = 4;
      }
    }
    else {
      info->chipset = (uint32_t)info_local >> 0x14 & 0x1ff;
      info->card_type = info->chipset & 0x1f0;
      if (info->card_type == 0x60) {
        info->card_type = 0x40;
      }
      else if ((info->card_type < 0x80) || (0xa0 < info->card_type)) {
        if ((0xbf < info->card_type) && (info->card_type < 0x101)) {
          info->card_type = 0xc0;
        }
      }
      else {
        info->card_type = 0x50;
      }
      for (local_1c = GPU_NV1; (int)local_1c < 0x5c; local_1c = local_1c + GPU_NV3) {
        if (((gpu_list[(int)local_1c].id_valid & 1U) != 0) &&
           (gpu_list[(int)local_1c].id == info->chipset)) {
          info->gpu = local_1c;
        }
      }
    }
    if (info->gpu == GPU_UNKNOWN) {
      info_local._4_4_ = -1;
    }
    else {
      info->gpu_desc = gpu_list + info->gpu;
      info_local._4_4_ = 0;
    }
  }
  else {
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

int parse_pmc_id(uint32_t pmc_id, struct chipset_info *info) {
	/* First, detect PMC_ID format and endianness */
	memset(info, 0, sizeof *info);
	info->endian = 0;
	info->gpu = GPU_UNKNOWN;
	info->gpu_desc = 0;
	if (pmc_id_flipped(pmc_id)) {
		/* bit 31 set - set endian flag and byteswap */
		info->endian = 1;
		pmc_id = (pmc_id & 0x0000ffff) << 16 | (pmc_id & 0xffff0000) >> 16;
		pmc_id = (pmc_id & 0x00ff00ff) << 8 | (pmc_id & 0xff00ff00) >> 8;
	}
	info->pmc_id = pmc_id;
	if (pmc_id & 0x80000000 && pmc_id & 0x00000F00) {
		/* bit 31 still set - ie. old bit 7 was set, and bits 8-11 are
		 * still nonzero - BAR0 is broken */
		return -1;
	}
	if (pmc_id & 0x80) {
		/* NV10+ */
		info->chipset = pmc_id >> 20 & 0x1ff;
		info->card_type = info->chipset & 0x1f0;
		if (info->card_type == 0x60) {
			info->card_type = 0x40;
		} else if (info->card_type >= 0x80 && info->card_type <= 0xa0) {
			info->card_type = 0x50;
		} else if (info->card_type >= 0xc0 && info->card_type <= 0x100) {
			info->card_type = 0xc0;
		}
		for (int i = 0; i < NUM_GPU; i++) {
			if (gpu_list[i].id_valid && gpu_list[i].id == info->chipset) {
				info->gpu = i;
			}
		}
	} else {
		/* pre-NV10 */
		if (pmc_id & 0xf000) {
			if (pmc_id & 0xf00000) {
				info->chipset = 5;
				info->gpu = GPU_NV5;
			} else {
				info->chipset = 4;
				info->gpu = GPU_NV4;
			}
			info->card_type = 4;
		} else {
			info->chipset = pmc_id >> 16 & 0xf;
			info->card_type = info->chipset;
			if (info->chipset == 1) {
				info->gpu = GPU_NV1;
			} else if (info->chipset == 3) {
				if ((pmc_id & 0xff) >= 0x20) {
					info->gpu = GPU_NV3T;
				} else {
					info->gpu = GPU_NV3;
				}
			}
		}
	}
	if (info->gpu != GPU_UNKNOWN) {
		info->gpu_desc = &gpu_list[info->gpu];
		return 0;
	} else {
		return -1;
	}
}